

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12CachePolicyULT.cpp
# Opt level: O2

void __thiscall CTestGen12CachePolicy::CheckLlcEdramCachePolicy(CTestGen12CachePolicy *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  undefined4 uVar1;
  ulong uVar2;
  ushort uVar3;
  AssertionResult *this_01;
  char *pcVar4;
  undefined4 uVar5;
  ulong uVar6;
  undefined1 local_b8 [8];
  GMM_CACHE_POLICY_ELEMENT ClientRequest;
  uint32_t local_88;
  uint32_t LeCC_WB_CACHEABLE;
  uint32_t TargetCache_LLC;
  uint32_t LeCC_WC_UNCACHEABLE;
  internal local_78 [8];
  AssertionResult gtest_ar;
  uint local_4c;
  internal iStack_48;
  uint32_t AssignedMocsIdx;
  AssertionResult gtest_ar_10;
  
  local_88 = 1;
  ClientRequest.IsOverridenByRegkey = 3;
  uVar6 = 0;
  this_00 = &gtest_ar_10.message_;
  LeCC_WB_CACHEABLE = local_88;
  do {
    if (uVar6 == 0x11e) {
      return;
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
              (local_b8,CommonULT::pGmmULTClientContext,uVar6 & 0xffffffff);
    local_4c = (uint)ClientRequest.field_1.Value._0_4_ >> 1 & 0x3f;
    uVar2 = (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x78))();
    _iStack_48 = _iStack_48 & 0xffffffff00000000;
    gtest_ar_10.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT44(gtest_ar_10.message_.ptr_._4_4_,(int)(uVar2 >> 6)) & 0xffffffff00000001);
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_78,"0","Mocs.LeCC.AOM",(int *)&stack0xffffffffffffffb8,(uint *)this_00);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffb8);
      std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
      std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
      std::operator<<((ostream *)(_iStack_48 + 0x10),": AOM is non-zero");
      pcVar4 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0x9c,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffffb8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    _iStack_48 = _iStack_48 & 0xffffffff00000000;
    uVar5 = (undefined4)uVar2;
    gtest_ar_10.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT44(gtest_ar_10.message_.ptr_._4_4_,(int)(uVar2 >> 0xf)) & 0xffffffff00000003);
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_78,"0","Mocs.LeCC.CoS",(int *)&stack0xffffffffffffffb8,(uint *)this_00);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffb8);
      std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
      std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
      std::operator<<((ostream *)(_iStack_48 + 0x10),": CoS is non-zero");
      pcVar4 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0x9d,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffffb8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    _iStack_48 = _iStack_48 & 0xffffffff00000000;
    gtest_ar_10.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT44(gtest_ar_10.message_.ptr_._4_4_,(int)(uVar2 >> 0xb)) & 0xffffffff00000007);
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_78,"0","Mocs.LeCC.PFM",(int *)&stack0xffffffffffffffb8,(uint *)this_00);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffb8);
      std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
      std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
      std::operator<<((ostream *)(_iStack_48 + 0x10),": PFM is non-zero");
      pcVar4 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0x9e,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffffb8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    _iStack_48 = _iStack_48 & 0xffffffff00000000;
    gtest_ar_10.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT44(gtest_ar_10.message_.ptr_._4_4_,(int)(uVar2 >> 8)) & 0xffffffff00000007);
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_78,"0","Mocs.LeCC.SCC",(int *)&stack0xffffffffffffffb8,(uint *)this_00);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffb8);
      std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
      std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
      std::operator<<((ostream *)(_iStack_48 + 0x10),": SCC is non-zero");
      pcVar4 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0x9f,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffffb8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    _iStack_48 = _iStack_48 & 0xffffffff00000000;
    gtest_ar_10.message_.ptr_._0_4_ =
         (uint)((*(uint *)&(CommonULT::pGfxAdapterInfo->SkuTable).field_1 >> 10 & 1) == 0) &
         (uint)(uVar2 >> 0xe) & 0x3ffff;
    testing::internal::CmpHelperEQ<int,int>
              (local_78,"0",
               "Mocs.LeCC.SCF & !const_cast<SKU_FEATURE_TABLE &>(pGfxAdapterInfo->SkuTable).FtrLLCBypass"
               ,(int *)&stack0xffffffffffffffb8,(int *)this_00);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffb8);
      std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
      std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
      std::operator<<((ostream *)(_iStack_48 + 0x10),": SCF is non-zero");
      pcVar4 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xa1,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffffb8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    _iStack_48 = _iStack_48 & 0xffffffff00000000;
    gtest_ar_10.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT44(gtest_ar_10.message_.ptr_._4_4_,(int)(uVar2 >> 7)) & 0xffffffff00000001);
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_78,"0","Mocs.LeCC.ESC",(int *)&stack0xffffffffffffffb8,(uint *)this_00);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffb8);
      std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
      std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
      std::operator<<((ostream *)(_iStack_48 + 0x10),": ESC is non-zero");
      pcVar4 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xa2,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffffb8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    _iStack_48 = _iStack_48 & 0xffffffff00000000;
    gtest_ar_10.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT44(gtest_ar_10.message_.ptr_._4_4_,(int)(uVar2 >> 0x13)) & 0xffffffff00001fff);
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_78,"0","Mocs.LeCC.Reserved",(int *)&stack0xffffffffffffffb8,(uint *)this_00);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffb8);
      std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
      std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
      std::operator<<((ostream *)(_iStack_48 + 0x10),": Reserved field is non-zero");
      pcVar4 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xa3,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffffb8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    _iStack_48 = (ulong)(((ushort)ClientRequest.IDCode & 0x30) >> 4);
    gtest_ar_10.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT44(gtest_ar_10.message_.ptr_._4_4_,(int)(uVar2 >> 4)) & 0xffffffff00000003);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              (local_78,"ClientRequest.AGE","Mocs.LeCC.LRUM",
               (unsigned_long *)&stack0xffffffffffffffb8,(uint *)this_00);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffb8);
      std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
      std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
      std::operator<<((ostream *)(_iStack_48 + 0x10),": Incorrect AGE settings");
      pcVar4 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xa6,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffffb8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    _iStack_48 = (ulong)(ClientRequest.IDCode._2_2_ & 3);
    gtest_ar_10.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT44(gtest_ar_10.message_.ptr_._4_4_,(int)(uVar2 >> 0x11)) & 0xffffffff00000003);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              (local_78,"ClientRequest.SSO","Mocs.LeCC.SelfSnoop",
               (unsigned_long *)&stack0xffffffffffffffb8,(uint *)this_00);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffb8);
      std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
      std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
      std::operator<<((ostream *)(_iStack_48 + 0x10),": Self Snoop is non-zero");
      pcVar4 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xa9,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffffb8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    _iStack_48 = CONCAT44(AssignedMocsIdx,0x40);
    testing::internal::CmpHelperGT<int,unsigned_int>
              (local_78,"(64)","AssignedMocsIdx",(int *)&stack0xffffffffffffffb8,&local_4c);
    if (local_78[0] == (internal)0x0) {
      testing::Message::Message((Message *)&stack0xffffffffffffffb8);
      std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
      std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
      std::operator<<((ostream *)(_iStack_48 + 0x10),": MOCS Index greater than MAX allowed (63)");
      pcVar4 = "";
      if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
        pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)this_00,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                 ,0xac,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&stack0xffffffffffffffb8);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    uVar3 = ClientRequest.IDCode._2_2_ >> 3 & 3;
    if (uVar3 == 3) {
      (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
                (local_78,CommonULT::pGmmULTClientContext,0x3b);
      gtest_ar_10.message_.ptr_._0_4_ = 0x3d;
      testing::internal::CmpHelperEQ<unsigned_int,int>
                (&stack0xffffffffffffffb8,"AssignedMocsIdx","61",&local_4c,(int *)this_00);
      if (iStack_48 == (internal)0x0) {
        testing::Message::Message((Message *)this_00);
        std::operator<<((ostream *)((gtest_ar_10.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
        std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar_10.message_.ptr_)->field_2);
        std::operator<<((ostream *)((gtest_ar_10.message_.ptr_)->field_2)._M_local_buf,
                        ": Incorrect Index for L3Eviction type# ");
        std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar_10.message_.ptr_)->field_2);
        pcVar4 = "";
        if (gtest_ar_10._0_8_ != 0) {
          pcVar4 = *(char **)gtest_ar_10._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&TargetCache_LLC,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xbf,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&TargetCache_LLC,(Message *)this_00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&TargetCache_LLC);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this_00);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_10);
      TargetCache_LLC = 0;
      gtest_ar_10.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)((ushort)ClientRequest.IDCode & 1);
      testing::internal::CmpHelperEQ<int,unsigned_long>
                (&stack0xffffffffffffffb8,"0","ClientRequest.LLC",(int *)&TargetCache_LLC,
                 (unsigned_long *)this_00);
      if (iStack_48 == (internal)0x0) {
        testing::Message::Message((Message *)this_00);
        std::operator<<((ostream *)((gtest_ar_10.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
        std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar_10.message_.ptr_)->field_2);
        std::operator<<((ostream *)((gtest_ar_10.message_.ptr_)->field_2)._M_local_buf,
                        ": Incorrect LLC cacheability for L3Eviction type# ");
        std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar_10.message_.ptr_)->field_2);
        pcVar4 = "";
        if (gtest_ar_10._0_8_ != 0) {
          pcVar4 = *(char **)gtest_ar_10._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&TargetCache_LLC,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xc0,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&TargetCache_LLC,(Message *)this_00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&TargetCache_LLC);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this_00);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_10);
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                (&stack0xffffffffffffffb8,"MOCS61.Value","ClientRequest.Value",
                 (unsigned_long *)&gtest_ar,(unsigned_long *)&ClientRequest);
      if (iStack_48 == (internal)0x0) {
        testing::Message::Message((Message *)this_00);
        std::operator<<((ostream *)((gtest_ar_10.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
        std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar_10.message_.ptr_)->field_2);
        std::operator<<((ostream *)((gtest_ar_10.message_.ptr_)->field_2)._M_local_buf,
                        ": Incorrect usage for L3Eviction type# ");
        std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar_10.message_.ptr_)->field_2);
        pcVar4 = "";
        if (gtest_ar_10._0_8_ != 0) {
          pcVar4 = *(char **)gtest_ar_10._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&TargetCache_LLC,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xc1,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&TargetCache_LLC,(Message *)this_00);
        goto LAB_0011b6c6;
      }
      goto LAB_0011b6da;
    }
    if (uVar3 == 2) {
      (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
                (local_78,CommonULT::pGmmULTClientContext,0x3a);
      if (uVar6 == 0x3a) {
        gtest_ar_10.message_.ptr_._0_4_ = 0x3f;
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  (&stack0xffffffffffffffb8,"AssignedMocsIdx","63",&local_4c,(int *)this_00);
        if (iStack_48 == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          std::operator<<((ostream *)((gtest_ar_10.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
          std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar_10.message_.ptr_)->field_2);
          std::operator<<((ostream *)((gtest_ar_10.message_.ptr_)->field_2)._M_local_buf,
                          ": Incorrect Index for L3Eviction type# ");
          std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar_10.message_.ptr_)->field_2);
          pcVar4 = "";
          if (gtest_ar_10._0_8_ != 0) {
            pcVar4 = *(char **)gtest_ar_10._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&TargetCache_LLC,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xb3,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&TargetCache_LLC,(Message *)this_00);
LAB_0011b6c6:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&TargetCache_LLC);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this_00);
        }
      }
      else {
        gtest_ar.success_ = (bool)(gtest_ar.success_ | 4);
        gtest_ar_10.message_.ptr_._0_4_ = 0x3f;
        testing::internal::CmpHelperNE<unsigned_int,int>
                  (&stack0xffffffffffffffb8,"AssignedMocsIdx","63",&local_4c,(int *)this_00);
        if (iStack_48 == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          std::operator<<((ostream *)((gtest_ar_10.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
          std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar_10.message_.ptr_)->field_2);
          std::operator<<((ostream *)((gtest_ar_10.message_.ptr_)->field_2)._M_local_buf,
                          ": Incorrect Index for L3Eviction type# ");
          std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar_10.message_.ptr_)->field_2);
          pcVar4 = "";
          if (gtest_ar_10._0_8_ != 0) {
            pcVar4 = *(char **)gtest_ar_10._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&TargetCache_LLC,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xb8,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&TargetCache_LLC,(Message *)this_00);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&TargetCache_LLC);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this_00);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_10);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  (&stack0xffffffffffffffb8,"MOCS63.Value","ClientRequest.Value",
                   (unsigned_long *)&gtest_ar,(unsigned_long *)&ClientRequest);
        if (iStack_48 == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          std::operator<<((ostream *)((gtest_ar_10.message_.ptr_)->field_2)._M_local_buf,"Usage# ");
          std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar_10.message_.ptr_)->field_2);
          std::operator<<((ostream *)((gtest_ar_10.message_.ptr_)->field_2)._M_local_buf,
                          ": Incorrect usage for L3Eviction type# ");
          std::ostream::_M_insert<unsigned_long>((ulong)&(gtest_ar_10.message_.ptr_)->field_2);
          pcVar4 = "";
          if (gtest_ar_10._0_8_ != 0) {
            pcVar4 = *(char **)gtest_ar_10._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&TargetCache_LLC,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xb9,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&TargetCache_LLC,(Message *)this_00);
          goto LAB_0011b6c6;
        }
      }
LAB_0011b6da:
      this_01 = &gtest_ar_10;
    }
    else {
      if ((int)uVar6 == 0x39) {
        _iStack_48 = CONCAT44(AssignedMocsIdx,0x3e);
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  (local_78,"AssignedMocsIdx","62",&local_4c,(int *)&stack0xffffffffffffffb8);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffffb8);
          std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
          std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
          std::operator<<((ostream *)(_iStack_48 + 0x10),": Incorrect Index for MOCS_62");
          pcVar4 = "";
          if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
            pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xc9,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
          goto LAB_0011b8e0;
        }
      }
      else if ((int)uVar6 == 0x1d) {
        _iStack_48 = CONCAT44(AssignedMocsIdx,0x3c);
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  (local_78,"AssignedMocsIdx","60",&local_4c,(int *)&stack0xffffffffffffffb8);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffffb8);
          std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
          std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
          std::operator<<((ostream *)(_iStack_48 + 0x10),": Incorrect Index for CCS");
          pcVar4 = "";
          if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
            pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xc5,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
          goto LAB_0011b8e0;
        }
      }
      else if ((ClientRequest.IDCode._2_2_ & 4) == 0) {
        _iStack_48 = CONCAT44(AssignedMocsIdx,0x30);
        testing::internal::CmpHelperLT<unsigned_int,int>
                  (local_78,"AssignedMocsIdx","(48)",&local_4c,(int *)&stack0xffffffffffffffb8);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffffb8);
          std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
          std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
          std::operator<<((ostream *)(_iStack_48 + 0x10),": Incorrect Index for HDCL1 setting");
          pcVar4 = "";
          if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
            pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xd2,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
LAB_0011b8e0:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&stack0xffffffffffffffb8);
        }
      }
      else {
        _iStack_48 = CONCAT44(AssignedMocsIdx,0x30);
        testing::internal::CmpHelperGE<unsigned_int,int>
                  (local_78,"AssignedMocsIdx","(48)",&local_4c,(int *)&stack0xffffffffffffffb8);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffffb8);
          std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
          std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
          std::operator<<((ostream *)(_iStack_48 + 0x10),": Incorrect Index for HDCL1 setting");
          pcVar4 = "";
          if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
            pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xce,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
          goto LAB_0011b8e0;
        }
      }
      this_01 = &gtest_ar;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_01);
    if (((ushort)ClientRequest.IDCode & 3) == 0) {
      _iStack_48 = CONCAT44(AssignedMocsIdx,uVar5) & 0xffffffff00000003;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                (local_78,"LeCC_WC_UNCACHEABLE","Mocs.LeCC.Cacheability",&LeCC_WB_CACHEABLE,
                 (uint *)&stack0xffffffffffffffb8);
      if (local_78[0] == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xffffffffffffffb8);
        std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
        std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
        std::operator<<((ostream *)(_iStack_48 + 0x10),": Incorrect LLC/eDRAM cachebility setting");
        pcVar4 = "";
        if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
          pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)this_00,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                   ,0xd7,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
        goto LAB_0011bc82;
      }
    }
    else {
      uVar1 = (undefined4)(uVar2 >> 2);
      if (((ushort)ClientRequest.IDCode & 1) == 0) {
        _iStack_48 = CONCAT44(AssignedMocsIdx,uVar1) & 0xffffffff00000003;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  (local_78,"TargetCache_LLC","Mocs.LeCC.TargetCache",&local_88,
                   (uint *)&stack0xffffffffffffffb8);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffffb8);
          std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
          std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
          std::operator<<((ostream *)(_iStack_48 + 0x10),": Incorrect target cache setting");
          pcVar4 = "";
          if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
            pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xe3,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&stack0xffffffffffffffb8);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
        _iStack_48 = CONCAT44(AssignedMocsIdx,uVar5) & 0xffffffff00000003;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  (local_78,"LeCC_WC_UNCACHEABLE","Mocs.LeCC.Cacheability",&LeCC_WB_CACHEABLE,
                   (uint *)&stack0xffffffffffffffb8);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffffb8);
          std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
          std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
          std::operator<<((ostream *)(_iStack_48 + 0x10),": Incorrect LLC cachebility setting");
          pcVar4 = "";
          if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
            pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xe5,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
LAB_0011bc82:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&stack0xffffffffffffffb8);
        }
      }
      else {
        _iStack_48 = CONCAT44(AssignedMocsIdx,uVar1) & 0xffffffff00000003;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  (local_78,"TargetCache_LLC","Mocs.LeCC.TargetCache",&local_88,
                   (uint *)&stack0xffffffffffffffb8);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffffb8);
          std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
          std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
          std::operator<<((ostream *)(_iStack_48 + 0x10),": Incorrect target cache setting");
          pcVar4 = "";
          if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
            pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xdd,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&stack0xffffffffffffffb8);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
        _iStack_48 = CONCAT44(AssignedMocsIdx,uVar5) & 0xffffffff00000003;
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                  (local_78,"LeCC_WB_CACHEABLE","Mocs.LeCC.Cacheability",
                   &ClientRequest.IsOverridenByRegkey,(uint *)&stack0xffffffffffffffb8);
        if (local_78[0] == (internal)0x0) {
          testing::Message::Message((Message *)&stack0xffffffffffffffb8);
          std::operator<<((ostream *)(_iStack_48 + 0x10),"Usage# ");
          std::ostream::_M_insert<unsigned_long>(_iStack_48 + 0x10);
          std::operator<<((ostream *)(_iStack_48 + 0x10),": Incorrect LLC cachebility setting");
          pcVar4 = "";
          if ((undefined8 *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (undefined8 *)0x0) {
            pcVar4 = *(char **)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)this_00,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen12CachePolicyULT.cpp"
                     ,0xdf,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)this_00,(Message *)&stack0xffffffffffffffb8);
          goto LAB_0011bc82;
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void CTestGen12CachePolicy::CheckLlcEdramCachePolicy()
{
    const uint32_t TargetCache_LLC = 1;

    const uint32_t LeCC_UNCACHEABLE    = 0x0;
    const uint32_t LeCC_WC_UNCACHEABLE = 0x1;
    const uint32_t LeCC_WB_CACHEABLE   = 0x3;
    const uint32_t LeCC_WT_CACHEABLE   = 0x2;

    // Check Usage MOCS index against MOCS settings
    for(uint32_t Usage = GMM_RESOURCE_USAGE_UNKNOWN; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
    {
        GMM_CACHE_POLICY_ELEMENT     ClientRequest   = pGmmULTClientContext->GetCachePolicyElement((GMM_RESOURCE_USAGE_TYPE)Usage);
        uint32_t                        AssignedMocsIdx = ClientRequest.MemoryObjectOverride.Gen12.Index;
        GMM_CACHE_POLICY_TBL_ELEMENT Mocs            = pGmmULTClientContext->GetCachePolicyTlbElement(AssignedMocsIdx);

        // Check for unused fields
        EXPECT_EQ(0, Mocs.LeCC.AOM) << "Usage# " << Usage << ": AOM is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.CoS) << "Usage# " << Usage << ": CoS is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.PFM) << "Usage# " << Usage << ": PFM is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.SCC) << "Usage# " << Usage << ": SCC is non-zero";
        // SCF field might be set for LKF/Gen12+ platforms;
        EXPECT_EQ(0, Mocs.LeCC.SCF & !const_cast<SKU_FEATURE_TABLE &>(pGfxAdapterInfo->SkuTable).FtrLLCBypass) << "Usage# " << Usage << ": SCF is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.ESC) << "Usage# " << Usage << ": ESC is non-zero";
        EXPECT_EQ(0, Mocs.LeCC.Reserved) << "Usage# " << Usage << ": Reserved field is non-zero";

        // Check for age
        EXPECT_EQ(ClientRequest.AGE, Mocs.LeCC.LRUM) << "Usage# " << Usage << ": Incorrect AGE settings";

        // Check for Snoop Setting
        EXPECT_EQ(ClientRequest.SSO, Mocs.LeCC.SelfSnoop) << "Usage# " << Usage << ": Self Snoop is non-zero";

        // Check if Mocs Index is not greater than GMM_MAX_NUMBER_MOCS_INDEXES
        EXPECT_GT(GMM_MAX_NUMBER_MOCS_INDEXES, AssignedMocsIdx) << "Usage# " << Usage << ": MOCS Index greater than MAX allowed (63)";

        if(ClientRequest.L3Eviction == 0x2) //63
        {
            GMM_CACHE_POLICY_ELEMENT MOCS63 = pGmmULTClientContext->GetCachePolicyElement(GMM_RESOURCE_USAGE_L3_EVICTION);
            if((GMM_RESOURCE_USAGE_TYPE)Usage == GMM_RESOURCE_USAGE_L3_EVICTION)
            {
                EXPECT_EQ(AssignedMocsIdx, 63) << "Usage# " << Usage << ": Incorrect Index for L3Eviction type# " << ClientRequest.L3Eviction;
            }
            else
            {
                MOCS63.L3 = 1; //Override L3 to test , since Hw forces it to L3-uncached
                EXPECT_NE(AssignedMocsIdx, 63) << "Usage# " << Usage << ": Incorrect Index for L3Eviction type# " << ClientRequest.L3Eviction;
                EXPECT_EQ(MOCS63.Value, ClientRequest.Value) << "Usage# " << Usage << ": Incorrect usage for L3Eviction type# " << ClientRequest.L3Eviction;
            }
        }
        else if(ClientRequest.L3Eviction == 0x3) //61
        {
            GMM_CACHE_POLICY_ELEMENT MOCS61 = pGmmULTClientContext->GetCachePolicyElement(GMM_RESOURCE_USAGE_L3_EVICTION_SPECIAL);
            EXPECT_EQ(AssignedMocsIdx, 61) << "Usage# " << Usage << ": Incorrect Index for L3Eviction type# " << ClientRequest.L3Eviction;
            EXPECT_EQ(0, ClientRequest.LLC) << "Usage# " << Usage << ": Incorrect LLC cacheability for L3Eviction type# " << ClientRequest.L3Eviction;
            EXPECT_EQ(MOCS61.Value, ClientRequest.Value) << "Usage# " << Usage << ": Incorrect usage for L3Eviction type# " << ClientRequest.L3Eviction;
        }
        else if(Usage == GMM_RESOURCE_USAGE_CCS) //60
        {
            EXPECT_EQ(AssignedMocsIdx, 60) << "Usage# " << Usage << ": Incorrect Index for CCS";
        }
        else if(Usage == GMM_RESOURCE_USAGE_MOCS_62) //62
        {
            EXPECT_EQ(AssignedMocsIdx, 62) << "Usage# " << Usage << ": Incorrect Index for MOCS_62";
        }
        // Check of assigned Index setting is appropriate for HDCL1 setting
        else if(ClientRequest.HDCL1)
        {
            EXPECT_GE(AssignedMocsIdx, GMM_GEN10_HDCL1_MOCS_INDEX_START) << "Usage# " << Usage << ": Incorrect Index for HDCL1 setting";
        }
        else
        {
            EXPECT_LT(AssignedMocsIdx, GMM_GEN10_HDCL1_MOCS_INDEX_START) << "Usage# " << Usage << ": Incorrect Index for HDCL1 setting";
        }

        if(!ClientRequest.LLC && !ClientRequest.ELLC) // Uncached
        {
            EXPECT_EQ(LeCC_WC_UNCACHEABLE, Mocs.LeCC.Cacheability) << "Usage# " << Usage << ": Incorrect LLC/eDRAM cachebility setting";
        }
        else
        {
            if(ClientRequest.LLC) // LLC only
            {
                EXPECT_EQ(TargetCache_LLC, Mocs.LeCC.TargetCache) << "Usage# " << Usage << ": Incorrect target cache setting";

                EXPECT_EQ(LeCC_WB_CACHEABLE, Mocs.LeCC.Cacheability) << "Usage# " << Usage << ": Incorrect LLC cachebility setting";
            }
            else
            {
                EXPECT_EQ(TargetCache_LLC, Mocs.LeCC.TargetCache) << "Usage# " << Usage << ": Incorrect target cache setting";

                EXPECT_EQ(LeCC_WC_UNCACHEABLE, Mocs.LeCC.Cacheability) << "Usage# " << Usage << ": Incorrect LLC cachebility setting";
            }
        }
    }
}